

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

void __thiscall
toml::basic_value<toml::type_config>::basic_value
          (basic_value<toml::type_config> *this,string_type *x,string_format_info fmt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *com,region_type *reg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this->type_ = string;
  std::__cxx11::string::string(&local_48,x);
  paVar1 = &(this->field_1).string_.value.field_2;
  (this->field_1).integer_.value = (value_type_conflict4)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == &local_48.field_2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(this->field_1).string_.value.field_2 + 8) = local_48.field_2._8_8_;
  }
  else {
    (this->field_1).integer_.value = (value_type_conflict4)local_48._M_dataplus._M_p;
    (this->field_1).string_.value.field_2._M_allocated_capacity =
         CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,local_48.field_2._M_local_buf[0]);
  }
  (this->field_1).string_.value._M_string_length = local_48._M_string_length;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  *(string_format *)((long)&this->field_1 + 0x20) = fmt.fmt;
  *(bool *)((long)&this->field_1 + 0x21) = fmt.start_with_newline;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::~string((string *)&local_48);
  detail::region::region(&this->region_,reg);
  pbVar2 = (com->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (com->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
  (this->comments_).comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (com->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (com->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (com->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (com->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

basic_value(string_type x, string_format_info fmt,
                std::vector<std::string> com, region_type reg)
        : type_(value_t::string), string_(string_storage(std::move(x), std::move(fmt))),
          region_(std::move(reg)), comments_(std::move(com))
    {}